

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

int ImGui::PlotEx(ImGuiPlotType plot_type,char *label,_func_float_void_ptr_int *values_getter,
                 void *data,int values_count,int values_offset,char *overlay_text,float scale_min,
                 float scale_max,ImVec2 frame_size)

{
  ImVec2 *p;
  undefined1 auVar1 [12];
  ImU32 IVar2;
  ImVec2 p_max;
  void *pvVar3;
  bool bVar4;
  ImGuiID id;
  ImU32 IVar5;
  ImU32 IVar6;
  int iVar7;
  int iVar8;
  ImGuiContext *g;
  ImGuiContext *pIVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ImVec2 IVar15;
  ImVec2 pos;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  float fVar19;
  undefined8 uVar21;
  undefined1 auVar20 [16];
  float fVar22;
  uint local_120;
  float local_108;
  ImVec2 local_f0;
  ImGuiWindow *local_e8;
  void *local_e0;
  float local_d8;
  undefined1 local_c8 [16];
  ImGuiContext *local_b8;
  ImVec2 pos0;
  ImRect inner_bb;
  ImRect frame_bb;
  ImRect total_bb;
  
  pIVar9 = GImGui;
  local_e8 = GImGui->CurrentWindow;
  local_e8->WriteAccessed = true;
  if (local_e8->SkipItems == false) {
    local_c8._8_4_ = in_XMM2_Dc;
    local_c8._0_8_ = frame_size;
    local_c8._12_4_ = in_XMM2_Dd;
    local_e0 = data;
    local_d8 = scale_max;
    id = ImGuiWindow::GetID(local_e8,label,(char *)0x0);
    IVar15 = CalcTextSize(label,(char *)0x0,true,-1.0);
    uVar21 = local_c8._8_8_;
    if ((local_c8._0_4_ == 0.0) && (!NAN(local_c8._0_4_))) {
      fVar11 = CalcItemWidth();
      auVar1._4_8_ = uVar21;
      auVar1._0_4_ = local_c8._4_4_;
      auVar20._0_8_ = auVar1._0_8_ << 0x20;
      auVar20._8_4_ = local_c8._8_4_;
      auVar20._12_4_ = local_c8._12_4_;
      local_c8._4_12_ = auVar20._4_12_;
      local_c8._0_4_ = fVar11;
    }
    fVar16 = local_c8._4_4_;
    fVar11 = IVar15.x;
    if ((fVar16 != 0.0) || (NAN(fVar16))) {
      fVar13 = (pIVar9->Style).FramePadding.y;
    }
    else {
      fVar13 = (pIVar9->Style).FramePadding.y;
      fVar16 = fVar13 + fVar13 + IVar15.y;
      local_c8._4_4_ = fVar16;
    }
    frame_bb.Min.x = (local_e8->DC).CursorPos.x;
    frame_bb.Min.y = (local_e8->DC).CursorPos.y;
    frame_bb.Max.x = local_c8._0_4_ + frame_bb.Min.x;
    frame_bb.Max.y = fVar16 + frame_bb.Min.y;
    fVar16 = (pIVar9->Style).FramePadding.x;
    inner_bb.Min.x = fVar16 + frame_bb.Min.x;
    inner_bb.Min.y = frame_bb.Min.y + fVar13;
    inner_bb.Max.x = frame_bb.Max.x - fVar16;
    inner_bb.Max.y = frame_bb.Max.y - fVar13;
    fVar16 = 0.0;
    if (0.0 < fVar11) {
      fVar16 = (pIVar9->Style).ItemInnerSpacing.x + fVar11;
    }
    local_b8 = pIVar9;
    total_bb.Max.x = frame_bb.Max.x + fVar16;
    total_bb.Max.y = frame_bb.Max.y + 0.0;
    total_bb.Min.x = frame_bb.Min.x;
    total_bb.Min.y = frame_bb.Min.y;
    ItemSize(&total_bb,fVar13);
    bVar4 = ItemAdd(&total_bb,0,&frame_bb,0);
    if (bVar4) {
      bVar4 = ItemHoverable(&frame_bb,id);
      if (((scale_min == 3.4028235e+38) && (!NAN(scale_min))) ||
         ((local_108 = scale_min, local_d8 == 3.4028235e+38 && (!NAN(local_d8))))) {
        iVar8 = 0;
        iVar7 = 0;
        if (0 < values_count) {
          iVar7 = values_count;
        }
        fVar16 = 3.4028235e+38;
        fVar13 = -3.4028235e+38;
        for (; iVar7 != iVar8; iVar8 = iVar8 + 1) {
          fVar12 = (*values_getter)(local_e0,iVar8);
          if (!NAN(fVar12)) {
            if (fVar12 <= fVar16) {
              fVar16 = fVar12;
            }
            fVar13 = (float)((uint)fVar13 & -(uint)(fVar12 <= fVar13) |
                            ~-(uint)(fVar12 <= fVar13) & (uint)fVar12);
          }
        }
        local_108 = (float)(~-(uint)(scale_min == 3.4028235e+38) & (uint)scale_min |
                           (uint)fVar16 & -(uint)(scale_min == 3.4028235e+38));
        local_d8 = (float)(~-(uint)(local_d8 == 3.4028235e+38) & (uint)local_d8 |
                          (uint)fVar13 & -(uint)(local_d8 == 3.4028235e+38));
      }
      IVar15.y = frame_bb.Min.y;
      IVar15.x = frame_bb.Min.x;
      p_max.y = frame_bb.Max.y;
      p_max.x = frame_bb.Max.x;
      IVar5 = GetColorU32(7,1.0);
      pIVar9 = local_b8;
      RenderFrame(IVar15,p_max,IVar5,true,(local_b8->Style).FrameRounding);
      if (values_count < (int)((plot_type == ImGuiPlotType_Lines) + 1)) {
        local_120 = 0xffffffff;
      }
      else {
        iVar7 = (int)(float)local_c8._0_4_;
        if (values_count <= (int)(float)local_c8._0_4_) {
          iVar7 = values_count;
        }
        iVar8 = values_count - (uint)(plot_type == ImGuiPlotType_Lines);
        local_120 = 0xffffffff;
        if (bVar4) {
          p = &(local_b8->IO).MousePos;
          bVar4 = ImRect::Contains(&inner_bb,p);
          pvVar3 = local_e0;
          if (bVar4) {
            fVar13 = (p->x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x);
            fVar16 = 0.9999;
            if (fVar13 <= 0.9999) {
              fVar16 = fVar13;
            }
            local_120 = (uint)((float)iVar8 * (float)(~-(uint)(fVar13 < 0.0) & (uint)fVar16));
            if (((int)local_120 < 0) || (values_count <= (int)local_120)) {
              __assert_fail("v_idx >= 0 && v_idx < values_count",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui_widgets.cpp"
                            ,0x1964,
                            "int ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                           );
            }
            fVar16 = (*values_getter)(local_e0,(int)(local_120 + values_offset) % values_count);
            (*values_getter)(pvVar3,(int)(local_120 + values_offset + 1) % values_count);
            if (plot_type == ImGuiPlotType_Lines) {
              SetTooltip("%d: %8.4g\n%d: %8.4g",(ulong)local_120,(ulong)(local_120 + 1));
            }
            else if (plot_type == ImGuiPlotType_Histogram) {
              SetTooltip("%d: %8.4g",(double)fVar16,(ulong)local_120);
            }
          }
        }
        iVar7 = iVar7 - (uint)(plot_type == ImGuiPlotType_Lines);
        fVar13 = (float)iVar7;
        local_c8 = ZEXT416(~-(uint)(local_108 == local_d8) & (uint)(1.0 / (local_d8 - local_108)));
        fVar16 = (*values_getter)(local_e0,values_offset % values_count);
        fVar12 = (fVar16 - local_108) * (float)local_c8._0_4_;
        fVar16 = 1.0;
        if (fVar12 <= 1.0) {
          fVar16 = fVar12;
        }
        if (0.0 <= local_d8 * local_108) {
          fVar17 = (float)(~-(uint)(local_108 < 0.0) & 0x3f800000);
        }
        else {
          fVar17 = local_108 * (float)local_c8._0_4_ + 1.0;
        }
        IVar5 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x28,1.0);
        IVar6 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x29,1.0);
        local_d8 = (float)iVar8;
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        fVar18 = 0.0;
        fVar16 = (float)(-(uint)(fVar12 < 0.0) & 0x3f800000 |
                        ~-(uint)(fVar12 < 0.0) & (uint)(1.0 - fVar16));
        while (bVar4 = iVar7 != 0, iVar7 = iVar7 + -1, pIVar9 = local_b8, bVar4) {
          uVar10 = (uint)(fVar18 * local_d8 + 0.5);
          if (((int)uVar10 < 0) || (values_count <= (int)uVar10)) {
            __assert_fail("v1_idx >= 0 && v1_idx < values_count",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui_widgets.cpp"
                          ,0x197e,
                          "int ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                         );
          }
          fVar14 = 1.0 / fVar13 + fVar18;
          fVar12 = (*values_getter)(local_e0,(int)(values_offset + 1 + uVar10) % values_count);
          fVar19 = (fVar12 - local_108) * (float)local_c8._0_4_;
          fVar12 = 1.0;
          if (fVar19 <= 1.0) {
            fVar12 = fVar19;
          }
          fVar19 = (float)(-(uint)(fVar19 < 0.0) & 0x3f800000 |
                          ~-(uint)(fVar19 < 0.0) & (uint)(1.0 - fVar12));
          fVar12 = inner_bb.Max.y - inner_bb.Min.y;
          fVar22 = fVar18 * (inner_bb.Max.x - inner_bb.Min.x) + inner_bb.Min.x;
          pos0.y = fVar16 * fVar12 + inner_bb.Min.y;
          pos0.x = fVar22;
          local_f0.x = (inner_bb.Max.x - inner_bb.Min.x) * fVar14 + inner_bb.Min.x;
          fVar18 = fVar14;
          fVar16 = fVar19;
          if (plot_type == ImGuiPlotType_Lines) {
            local_f0.y = fVar12 * fVar19 + inner_bb.Min.y;
            IVar2 = IVar5;
            if (local_120 == uVar10) {
              IVar2 = IVar6;
            }
            ImDrawList::AddLine(local_e8->DrawList,&pos0,&local_f0,IVar2,1.0);
          }
          else {
            local_f0.y = fVar12 * fVar17 + inner_bb.Min.y;
            if (plot_type == ImGuiPlotType_Histogram) {
              if (fVar22 + 2.0 <= local_f0.x) {
                local_f0.x = local_f0.x + -1.0;
              }
              IVar2 = IVar5;
              if (local_120 == uVar10) {
                IVar2 = IVar6;
              }
              ImDrawList::AddRectFilled(local_e8->DrawList,&pos0,&local_f0,IVar2,0.0,0);
            }
          }
        }
      }
      if (overlay_text != (char *)0x0) {
        pos0.y = frame_bb.Min.y + (pIVar9->Style).FramePadding.y;
        pos0.x = frame_bb.Min.x;
        local_f0.x = 0.5;
        local_f0.y = 0.0;
        RenderTextClipped(&pos0,&frame_bb.Max,overlay_text,(char *)0x0,(ImVec2 *)0x0,&local_f0,
                          (ImRect *)0x0);
      }
      if (fVar11 <= 0.0) {
        return local_120;
      }
      pos.x = frame_bb.Max.x + (pIVar9->Style).ItemInnerSpacing.x;
      pos.y = inner_bb.Min.y;
      RenderText(pos,label,(char *)0x0,true);
      return local_120;
    }
  }
  return -1;
}

Assistant:

int ImGui::PlotEx(ImGuiPlotType plot_type, const char* label, float (*values_getter)(void* data, int idx), void* data, int values_count, int values_offset, const char* overlay_text, float scale_min, float scale_max, ImVec2 frame_size)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return -1;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (frame_size.x == 0.0f)
        frame_size.x = CalcItemWidth();
    if (frame_size.y == 0.0f)
        frame_size.y = label_size.y + (style.FramePadding.y * 2);

    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    const ImRect inner_bb(frame_bb.Min + style.FramePadding, frame_bb.Max - style.FramePadding);
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0, &frame_bb))
        return -1;
    const bool hovered = ItemHoverable(frame_bb, id);

    // Determine scale from values if not specified
    if (scale_min == FLT_MAX || scale_max == FLT_MAX)
    {
        float v_min = FLT_MAX;
        float v_max = -FLT_MAX;
        for (int i = 0; i < values_count; i++)
        {
            const float v = values_getter(data, i);
            if (v != v) // Ignore NaN values
                continue;
            v_min = ImMin(v_min, v);
            v_max = ImMax(v_max, v);
        }
        if (scale_min == FLT_MAX)
            scale_min = v_min;
        if (scale_max == FLT_MAX)
            scale_max = v_max;
    }

    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    const int values_count_min = (plot_type == ImGuiPlotType_Lines) ? 2 : 1;
    int idx_hovered = -1;
    if (values_count >= values_count_min)
    {
        int res_w = ImMin((int)frame_size.x, values_count) + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);
        int item_count = values_count + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);

        // Tooltip on hover
        if (hovered && inner_bb.Contains(g.IO.MousePos))
        {
            const float t = ImClamp((g.IO.MousePos.x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x), 0.0f, 0.9999f);
            const int v_idx = (int)(t * item_count);
            IM_ASSERT(v_idx >= 0 && v_idx < values_count);

            const float v0 = values_getter(data, (v_idx + values_offset) % values_count);
            const float v1 = values_getter(data, (v_idx + 1 + values_offset) % values_count);
            if (plot_type == ImGuiPlotType_Lines)
                SetTooltip("%d: %8.4g\n%d: %8.4g", v_idx, v0, v_idx + 1, v1);
            else if (plot_type == ImGuiPlotType_Histogram)
                SetTooltip("%d: %8.4g", v_idx, v0);
            idx_hovered = v_idx;
        }

        const float t_step = 1.0f / (float)res_w;
        const float inv_scale = (scale_min == scale_max) ? 0.0f : (1.0f / (scale_max - scale_min));

        float v0 = values_getter(data, (0 + values_offset) % values_count);
        float t0 = 0.0f;
        ImVec2 tp0 = ImVec2( t0, 1.0f - ImSaturate((v0 - scale_min) * inv_scale) );                       // Point in the normalized space of our target rectangle
        float histogram_zero_line_t = (scale_min * scale_max < 0.0f) ? (1 + scale_min * inv_scale) : (scale_min < 0.0f ? 0.0f : 1.0f);   // Where does the zero line stands

        const ImU32 col_base = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLines : ImGuiCol_PlotHistogram);
        const ImU32 col_hovered = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLinesHovered : ImGuiCol_PlotHistogramHovered);

        for (int n = 0; n < res_w; n++)
        {
            const float t1 = t0 + t_step;
            const int v1_idx = (int)(t0 * item_count + 0.5f);
            IM_ASSERT(v1_idx >= 0 && v1_idx < values_count);
            const float v1 = values_getter(data, (v1_idx + values_offset + 1) % values_count);
            const ImVec2 tp1 = ImVec2( t1, 1.0f - ImSaturate((v1 - scale_min) * inv_scale) );

            // NB: Draw calls are merged together by the DrawList system. Still, we should render our batch are lower level to save a bit of CPU.
            ImVec2 pos0 = ImLerp(inner_bb.Min, inner_bb.Max, tp0);
            ImVec2 pos1 = ImLerp(inner_bb.Min, inner_bb.Max, (plot_type == ImGuiPlotType_Lines) ? tp1 : ImVec2(tp1.x, histogram_zero_line_t));
            if (plot_type == ImGuiPlotType_Lines)
            {
                window->DrawList->AddLine(pos0, pos1, idx_hovered == v1_idx ? col_hovered : col_base);
            }
            else if (plot_type == ImGuiPlotType_Histogram)
            {
                if (pos1.x >= pos0.x + 2.0f)
                    pos1.x -= 1.0f;
                window->DrawList->AddRectFilled(pos0, pos1, idx_hovered == v1_idx ? col_hovered : col_base);
            }

            t0 = t1;
            tp0 = tp1;
        }
    }

    // Text overlay
    if (overlay_text)
        RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, overlay_text, NULL, NULL, ImVec2(0.5f, 0.0f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, inner_bb.Min.y), label);

    // Return hovered index or -1 if none are hovered.
    // This is currently not exposed in the public API because we need a larger redesign of the whole thing, but in the short-term we are making it available in PlotEx().
    return idx_hovered;
}